

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

bool __thiscall
flatbuffers::go::GoGenerator::NamespacePtrLess::operator()
          (NamespacePtrLess *this,Definition *a,Definition *b)

{
  bool bVar1;
  
  bVar1 = operator<(a->defined_namespace,b->defined_namespace);
  return bVar1;
}

Assistant:

bool operator()(const Definition *a, const Definition *b) const {
      return *a->defined_namespace < *b->defined_namespace;
    }